

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

bool __thiscall Analyser::loadVariable(Analyser *this,string *var)

{
  bool bVar1;
  int *piVar2;
  Instruction local_60;
  Instruction local_50;
  _Optional_payload_base<int> local_40;
  Instruction local_38;
  _Optional_payload_base<int> local_28;
  optional<int> index;
  string *var_local;
  Analyser *this_local;
  
  index.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)var;
  local_28 = (_Optional_payload_base<int>)getIndexInLocal(this,var);
  bVar1 = std::optional<int>::has_value((optional<int> *)&local_28);
  if (bVar1) {
    piVar2 = std::optional<int>::value((optional<int> *)&local_28);
    Instruction::Instruction(&local_38,loada,0,*piVar2);
    addInstruction(this,&local_38);
    this_local._7_1_ = true;
  }
  else {
    local_40 = (_Optional_payload_base<int>)
               getIndexInGlobal(this,(string *)
                                     index.super__Optional_base<int,_true,_true>._M_payload.
                                     super__Optional_payload_base<int>);
    local_28 = local_40;
    bVar1 = std::optional<int>::has_value((optional<int> *)&local_28);
    if (bVar1) {
      if (this->_currentFunction == -1) {
        piVar2 = std::optional<int>::value((optional<int> *)&local_28);
        Instruction::Instruction(&local_50,loada,0,*piVar2);
        addInstruction(this,&local_50);
      }
      else {
        piVar2 = std::optional<int>::value((optional<int> *)&local_28);
        Instruction::Instruction(&local_60,loada,1,*piVar2);
        addInstruction(this,&local_60);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Analyser::loadVariable(const std::string& var) {
	std::optional<std::int32_t> index = getIndexInLocal(var);
	if (index.has_value()) {
		addInstruction(Instruction(Operation::loada, 0, index.value()));
		return true;
	}
	index = getIndexInGlobal(var);
	if (index.has_value()) {
		if (_currentFunction == -1) {
			addInstruction(Instruction(Operation::loada, 0, index.value()));
		}
		else {
			addInstruction(Instruction(Operation::loada, 1, index.value()));
		}
		return true;
	}
	return false;
}